

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

SecAttrOvr * getsecattrovr(GlobalVars *gv,char *name,uint32_t flags)

{
  int iVar1;
  SecAttrOvr *pSVar2;
  char *__s2;
  
  __s2 = "";
  if (name != (char *)0x0) {
    __s2 = name;
  }
  pSVar2 = (SecAttrOvr *)&gv->secattrovrs;
  do {
    pSVar2 = pSVar2->next;
    if (pSVar2 == (SecAttrOvr *)0x0) {
      return (SecAttrOvr *)0x0;
    }
    iVar1 = strcmp(pSVar2->name,__s2);
  } while ((iVar1 != 0) || ((pSVar2->flags & flags) == 0));
  return pSVar2;
}

Assistant:

struct SecAttrOvr *getsecattrovr(struct GlobalVars *gv,const char *name,
                                 uint32_t flags)
/* Return a SecAttrOvr node which matches section name and flags. */
{
  struct SecAttrOvr *sao;

  if (name == NULL)
    name = noname;
  for (sao=gv->secattrovrs; sao!=NULL; sao=sao->next) {
    if (!strcmp(sao->name,name) && (sao->flags & flags)!=0)
      break;
  }
  return sao;
}